

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::CordRepBtree::Destroy(CordRepBtree *tree)

{
  CordRep *rep;
  bool bVar1;
  int iVar2;
  iterator ppCVar3;
  CordRep *edge;
  iterator __end3;
  iterator __begin3;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_18;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range3;
  CordRepBtree *tree_local;
  
  __range3 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)tree;
  iVar2 = height(tree);
  if (iVar2 == 0) {
    ___begin3 = Edges((CordRepBtree *)__range3);
    local_18 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin3;
    __end3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_18);
    ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_18);
    for (; __end3 != ppCVar3; __end3 = __end3 + 1) {
      rep = *__end3;
      bVar1 = RefcountAndFlags::Decrement(&rep->refcount);
      if (!bVar1) {
        anon_unknown_0::DeleteLeafEdge(rep);
      }
    }
    Delete((CordRepBtree *)__range3);
  }
  else if (iVar2 == 1) {
    DestroyTree<1ul>((CordRepBtree *)__range3);
  }
  else {
    DestroyTree<2ul>((CordRepBtree *)__range3);
  }
  return;
}

Assistant:

void CordRepBtree::Destroy(CordRepBtree* tree) {
  switch (tree->height()) {
    case 0:
      for (CordRep* edge : tree->Edges()) {
        if (!edge->refcount.Decrement()) {
          DeleteLeafEdge(edge);
        }
      }
      return CordRepBtree::Delete(tree);
    case 1:
      return DestroyTree<1>(tree);
    default:
      return DestroyTree<2>(tree);
  }
}